

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.hpp
# Opt level: O2

void __thiscall test_suite::detail::simple_runner::summary::summary(summary *this,summary *other)

{
  this->name = other->name;
  (this->start).__d.__r = (other->start).__d.__r;
  (this->elapsed).__r = (other->elapsed).__r;
  (this->failed).super___atomic_base<unsigned_long>._M_i =
       (other->failed).super___atomic_base<unsigned_long>._M_i;
  (this->total).super___atomic_base<unsigned_long>._M_i =
       (other->total).super___atomic_base<unsigned_long>._M_i;
  return;
}

Assistant:

summary(summary const& other) noexcept
        : name(other.name)
        , start(other.start)
        , elapsed(other.elapsed)
        , failed(other.failed.load())
        , total(other.total.load())
    {
    }